

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::AddToWalletIfInvolvingMe
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool fUpdate,
          bool rescanning_old_block)

{
  base_blob<256u> *this_00;
  byte bVar1;
  CTransaction *tx;
  pointer pCVar2;
  pointer pCVar3;
  size_type sVar4;
  bool bVar5;
  ushort uVar6;
  optional<bool> oVar7;
  size_type sVar8;
  pointer pCVar9;
  CAddressBookData *pCVar10;
  undefined8 uVar11;
  CWalletTx *pCVar12;
  runtime_error *this_01;
  _Alloc_hider dest;
  pointer __k;
  _Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> _Var14;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var15;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar16;
  undefined1 rescanning_old_block_00;
  uint *in_stack_fffffffffffffec8;
  undefined1 local_e0 [24];
  TxState tx_state;
  _Storage<wallet::AddressPurpose,_true> local_98;
  uchar local_94;
  string local_78;
  undefined1 local_58 [40];
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> _Var13;
  
  local_58._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  tx = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((state->
      super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ).
      super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ._M_index == '\0') {
    pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start; __k != pCVar3; __k = __k + 1) {
      pVar16 = std::
               _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range(&(this->mapTxSpends)._M_h,&__k->prevout);
      _Var13 = pVar16.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
               _M_cur;
      while( true ) {
        _Var14 = pVar16.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                 _M_cur;
        if (_Var14.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur ==
            (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
            pVar16.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur) break;
        this_00 = (base_blob<256u> *)
                  ((long)_Var14.
                         super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                         _M_cur + 0x2c);
        bVar5 = operator!=((base_blob<256U> *)this_00,(base_blob<256U> *)&tx->hash);
        _Var15._M_cur =
             (__node_type *)
             pVar16.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
             _M_cur;
        if (bVar5) {
          base_blob<256u>::ToString_abi_cxx11_((string *)&tx_state,(base_blob<256u> *)&tx->hash);
          base_blob<256u>::ToString_abi_cxx11_((string *)local_58,(base_blob<256u> *)state);
          base_blob<256u>::ToString_abi_cxx11_(&local_78,this_00);
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&local_98,
                     (base_blob<256u> *)
                     ((long)_Var14.
                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                            _M_cur + 8));
          in_stack_fffffffffffffec8 =
               (uint *)((long)_Var14.
                              super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                              _M_cur + 0x28);
          WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                    (this,(ConstevalFormatString<5U>)0x6e455a,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx_state,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     in_stack_fffffffffffffec8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)local_58);
          std::__cxx11::string::~string((string *)&tx_state);
          MarkConflicted(this,(uint256 *)state,
                         *(int *)((long)&(state->
                                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         ).
                                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         ._M_u + 0x20),(uint256 *)this_00);
          _Var15 = _Var13.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                   _M_cur;
        }
        pVar16.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
             (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var15._M_cur;
        pVar16.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
             (__node_type *)
             *(_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
              _Var14.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
      }
    }
  }
  sVar8 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->mapWallet)._M_h,&(tx->hash).m_wrapped);
  if ((sVar8 == 0 || fUpdate) &&
     (((sVar8 != 0 || (bVar5 = IsMine(this,tx), bVar5)) || (bVar5 = IsFromMe(this,tx), bVar5)))) {
    pCVar9 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      rescanning_old_block_00 = SUB81(in_stack_fffffffffffffec8,0);
      if (pCVar9 == pCVar2) break;
      GetScriptPubKeyMans((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                           *)&tx_state,this,&pCVar9->scriptPubKey);
      for (uVar11 = tx_state.
                    super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    ._M_u._24_8_;
          (_Rb_tree_node_base *)uVar11 !=
          (_Rb_tree_node_base *)
          ((long)&tx_state.
                  super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  ._M_u + 8); uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11)) {
        (**(code **)(**(long **)(uVar11 + 0x20) + 0x50))
                  (&local_78,*(long **)(uVar11 + 0x20),&pCVar9->scriptPubKey);
        sVar4 = local_78._M_string_length;
        for (dest._M_p = local_78._M_dataplus._M_p; dest._M_p != (pointer)sVar4;
            dest._M_p = (pointer)((((CTxDestination *)((uchar *)dest._M_p + 0x50))->
                                  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  ).
                                  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  ._M_u._M_first._M_storage._M_storage + 8)) {
          bVar1 = (((CTxDestination *)((uchar *)dest._M_p + 0x50))->
                  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  ).
                  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  .
                  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  .
                  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  .
                  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  .
                  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  ._M_u._M_first._M_storage._M_storage[1];
          uVar6 = (ushort)bVar1;
          if (bVar1 == 0) {
            oVar7 = IsInternalScriptPubKeyMan(this,*(ScriptPubKeyMan **)(uVar11 + 0x20));
            *(_Optional_base<bool,_true,_true> *)
             &(((CTxDestination *)((uchar *)dest._M_p + 0x50))->
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ).
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 = oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool>;
            uVar6 = (ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                            super__Optional_payload_base<bool> >> 8;
          }
          if ((((uVar6 & 1) != 0) &&
              (*(char *)&(((CTxDestination *)((uchar *)dest._M_p + 0x50))->
                         super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         ).
                         super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               == '\0')) &&
             (pCVar10 = FindAddressBookEntry(this,(CTxDestination *)dest._M_p,false),
             pCVar10 == (CAddressBookData *)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_58,"",(allocator<char> *)(local_e0 + 0x17));
            local_98._M_value = RECEIVE;
            local_94 = '\x01';
            SetAddressBook(this,(CTxDestination *)dest._M_p,(string *)local_58,
                           (optional<wallet::AddressPurpose> *)&local_98);
            std::__cxx11::string::~string((string *)local_58);
          }
        }
        std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::~vector
                  ((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
                   &local_78);
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&tx_state);
      pCVar9 = pCVar9 + 1;
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:1279:43)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>_&>
      ::_S_vtable._M_arr
      [(state->
       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ).
       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ._M_index]._M_data)
              ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                *)&tx_state,(anon_class_1_0_00000001 *)local_58,state);
    std::make_shared<CTransaction_const,CTransaction_const&>((CTransaction *)local_e0);
    local_58._16_8_ = 0;
    local_58._24_8_ = 0;
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = 0;
    tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_state;
    tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (CTransaction *)local_e0;
    pCVar12 = AddToWallet(this,tx_00,(TxState *)local_58,(UpdateWalletTxFn *)0x0,
                          rescanning_old_block,(bool)rescanning_old_block_00);
    std::_Function_base::~_Function_base((_Function_base *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
    if (pCVar12 == (CWalletTx *)0x0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"DB error adding transaction to wallet, write failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_58._32_8_) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0045b54c;
    }
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_58._32_8_) {
    return bVar5;
  }
LAB_0045b54c:
  __stack_chk_fail();
}

Assistant:

bool CWallet::AddToWalletIfInvolvingMe(const CTransactionRef& ptx, const SyncTxState& state, bool fUpdate, bool rescanning_old_block)
{
    const CTransaction& tx = *ptx;
    {
        AssertLockHeld(cs_wallet);

        if (auto* conf = std::get_if<TxStateConfirmed>(&state)) {
            for (const CTxIn& txin : tx.vin) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(txin.prevout);
                while (range.first != range.second) {
                    if (range.first->second != tx.GetHash()) {
                        WalletLogPrintf("Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n", tx.GetHash().ToString(), conf->confirmed_block_hash.ToString(), range.first->second.ToString(), range.first->first.hash.ToString(), range.first->first.n);
                        MarkConflicted(conf->confirmed_block_hash, conf->confirmed_block_height, range.first->second);
                    }
                    range.first++;
                }
            }
        }

        bool fExisted = mapWallet.count(tx.GetHash()) != 0;
        if (fExisted && !fUpdate) return false;
        if (fExisted || IsMine(tx) || IsFromMe(tx))
        {
            /* Check if any keys in the wallet keypool that were supposed to be unused
             * have appeared in a new transaction. If so, remove those keys from the keypool.
             * This can happen when restoring an old wallet backup that does not contain
             * the mostly recently created transactions from newer versions of the wallet.
             */

            // loop though all outputs
            for (const CTxOut& txout: tx.vout) {
                for (const auto& spk_man : GetScriptPubKeyMans(txout.scriptPubKey)) {
                    for (auto &dest : spk_man->MarkUnusedAddresses(txout.scriptPubKey)) {
                        // If internal flag is not defined try to infer it from the ScriptPubKeyMan
                        if (!dest.internal.has_value()) {
                            dest.internal = IsInternalScriptPubKeyMan(spk_man);
                        }

                        // skip if can't determine whether it's a receiving address or not
                        if (!dest.internal.has_value()) continue;

                        // If this is a receiving address and it's not in the address book yet
                        // (e.g. it wasn't generated on this node or we're restoring from backup)
                        // add it to the address book for proper transaction accounting
                        if (!*dest.internal && !FindAddressBookEntry(dest.dest, /* allow_change= */ false)) {
                            SetAddressBook(dest.dest, "", AddressPurpose::RECEIVE);
                        }
                    }
                }
            }

            // Block disconnection override an abandoned tx as unconfirmed
            // which means user may have to call abandontransaction again
            TxState tx_state = std::visit([](auto&& s) -> TxState { return s; }, state);
            CWalletTx* wtx = AddToWallet(MakeTransactionRef(tx), tx_state, /*update_wtx=*/nullptr, /*fFlushOnClose=*/false, rescanning_old_block);
            if (!wtx) {
                // Can only be nullptr if there was a db write error (missing db, read-only db or a db engine internal writing error).
                // As we only store arriving transaction in this process, and we don't want an inconsistent state, let's throw an error.
                throw std::runtime_error("DB error adding transaction to wallet, write failed");
            }
            return true;
        }
    }
    return false;
}